

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O2

ON_wString __thiscall
ON_wString::FromTime
          (ON_wString *this,tm *t,ON_DateFormat date_format,ON_TimeFormat time_format,
          wchar_t date_separator,wchar_t date_time_separator,wchar_t time_separator)

{
  int iVar1;
  int month;
  int year;
  
  iVar1 = t->tm_mday;
  if (t->tm_mday - 0x20U < 0xffffffe1) {
    iVar1 = 0;
  }
  month = t->tm_mon + 1;
  if (0xb < (uint)t->tm_mon) {
    month = 0;
  }
  year = t->tm_year + 0x76c;
  if (t->tm_year < 0) {
    year = 0;
  }
  if ((month < 1) || (iVar1 < 1)) {
    iVar1 = t->tm_yday + 1;
    if (0x16d < (uint)t->tm_yday) {
      iVar1 = 0;
    }
    FromYearDayHourMinuteSecond
              (this,year,iVar1,t->tm_hour,t->tm_min,t->tm_sec,date_format,time_format,date_separator
               ,date_time_separator,time_separator);
  }
  else {
    FromYearMonthDayHourMinuteSecond
              (this,year,month,iVar1,t->tm_hour,t->tm_min,t->tm_sec,date_format,time_format,
               date_separator,date_time_separator,time_separator);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FromTime(
  const struct tm& t,
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  int mday = t.tm_mday;
  if (mday < 1 || mday > 31)
    mday = 0;

  int yday = t.tm_yday;
  if (yday < 0 || yday > 365)
    yday = 0;
  else
    yday++;

  int mon = t.tm_mon;
  if (mon < 0 || mon > 11)
    mon = 0;
  else
    mon++;

  int year = t.tm_year;
  if (year < 0)
    year = 0;
  else
    year += 1900;

  return (mon > 0 && mday > 0)
    ? ON_wString::FromYearMonthDayHourMinuteSecond(
      year, mon, mday,
      (int)t.tm_hour, (int)t.tm_min, (int)t.tm_sec,
      date_format,
      time_format,
      date_separator,
      date_time_separator,
      time_separator
    )
    : ON_wString::FromYearDayHourMinuteSecond(
      year, yday,
      (int)t.tm_hour, (int)t.tm_min, (int)t.tm_sec,
      date_format,
      time_format,
      date_separator,
      date_time_separator,
      time_separator
    );
}